

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ps2raster.cpp
# Opt level: O1

void rw::ps2::swizzleRaster(Raster *raster)

{
  int iVar1;
  uint8 *puVar2;
  uint uVar3;
  byte bVar4;
  uint uVar5;
  ulong uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  int iVar10;
  int iVar11;
  uint uVar12;
  uint uVar13;
  byte bVar14;
  uint uVar15;
  bool bVar16;
  uint8 tmpbuf [4096];
  byte local_1038 [4104];
  
  uVar9 = raster->format;
  if ((uVar9 & 0x6000) != 0) {
    bVar16 = (uVar9 >> 0xe & 1) == 0;
    bVar14 = *(byte *)((long)&raster->pixels + (long)nativeRasterOffset + 4);
    bVar4 = (byte)((bVar14 & 2) >> 1) & bVar16;
    iVar11 = (uint)bVar4 * 8 + 8;
    uVar12 = (uint)bVar4 + (uint)bVar4 * 2 + 1;
    if ((bVar14 & 4) != 0 && !bVar16) {
      uVar12 = 4;
      iVar11 = 0x20;
    }
    iVar1 = raster->width;
    if (iVar11 < iVar1) {
      iVar11 = iVar1;
    }
    if ((int)uVar12 < raster->height) {
      uVar12 = raster->height;
    }
    bVar4 = 0;
    if (1 < iVar1) {
      bVar4 = 0;
      iVar10 = 1;
      do {
        bVar4 = bVar4 + 1;
        iVar10 = iVar10 * 2;
      } while (iVar10 < iVar1);
    }
    puVar2 = raster->pixels;
    uVar15 = (4 << (bVar4 & 0x1f)) - 1;
    if (((uVar9 >> 0xe & 1) == 0) || ((bVar14 & 4) == 0)) {
      if (((uVar9 >> 0xd & 1) != 0) && ((bVar14 & 2) != 0)) {
        uVar9 = 0;
        do {
          uVar3 = 0;
          do {
            uVar5 = uVar3 | uVar9;
            uVar6 = 0;
            do {
              local_1038
              [(((uint)(uVar6 >> 2) & 2 | (uVar3 & 2) >> 1) +
                ((uint)(uVar6 >> 1) & 0x3ffffff8 | (uint)uVar6 & 7 ^ (uVar5 * 2 ^ uVar9) & 4) * 4 |
               (uVar5 >> 1 & 0x3ffffffe | uVar3 & 1) << (bVar4 + 1 & 0x1f)) & uVar15] =
                   puVar2[(uVar5 << (bVar4 & 0x1f)) + (uint)uVar6];
              uVar6 = uVar6 + 1;
            } while (iVar11 + (uint)(iVar11 == 0) != uVar6);
            uVar3 = uVar3 + 1;
          } while (uVar3 != 4);
          memcpy(puVar2 + (int)(uVar9 << (bVar4 & 0x1f)),local_1038,(ulong)(uint)(iVar11 * 4));
          uVar9 = uVar9 + 4;
        } while (uVar9 < uVar12);
      }
    }
    else {
      uVar9 = 0;
      do {
        uVar3 = 0;
        do {
          uVar7 = uVar3 | uVar9;
          uVar5 = 0;
          do {
            uVar13 = (uVar7 << (bVar4 & 0x1f)) + uVar5;
            uVar8 = (uVar5 >> 2 & 2 | (uVar3 & 2) >> 1) +
                    (uVar5 >> 1 & 0x3ffffff8 | uVar5 & 7 ^ (uVar7 * 2 ^ uVar9) & 4) * 4 |
                    (uVar7 >> 1 & 0x3ffffffe | uVar3 & 1) << (bVar4 + 1 & 0x1f);
            bVar14 = puVar2[uVar13 >> 1] >> 4;
            if ((uVar13 & 1) == 0) {
              bVar14 = puVar2[uVar13 >> 1] & 0xf;
            }
            uVar13 = (uVar8 & uVar15) >> 1;
            if ((uVar8 & 1) == 0) {
              bVar14 = local_1038[uVar13] & 0xf0 | bVar14;
            }
            else {
              bVar14 = bVar14 << 4 | local_1038[uVar13] & 0xf;
            }
            local_1038[uVar13] = bVar14;
            uVar5 = uVar5 + 1;
          } while (iVar11 + (uint)(iVar11 == 0) != uVar5);
          uVar3 = uVar3 + 1;
        } while (uVar3 != 4);
        memcpy(puVar2 + (int)(uVar9 << (bVar4 - 1 & 0x1f)),local_1038,(ulong)(uint)(iVar11 * 2));
        uVar9 = uVar9 + 4;
      } while (uVar9 < uVar12);
    }
  }
  return;
}

Assistant:

void
swizzleRaster(Raster *raster)
{
	uint8 tmpbuf[1024*4];	// 1024x4px, maximum possible width
	uint32 mask;
	int32 x, y, w, h;
	int32 i;
	int32 logw;
	Ps2Raster *natras = GETPS2RASTEREXT(raster);
	uint8 *px;

	if((raster->format & (Raster::PAL4|Raster::PAL8)) == 0)
		return;

	int minw, minh;
	transferMinSize(raster->format & Raster::PAL4 ? PSMT4 : PSMT8, natras->flags, &minw, &minh);
	w = max(raster->width, minw);
	h = max(raster->height, minh);
	px = raster->pixels;
	logw = 0;
	for(i = 1; i < raster->width; i *= 2) logw++;
	mask = (1<<(logw+2))-1;

	if(raster->format & Raster::PAL4 && natras->flags & Ps2Raster::SWIZZLED4){
		for(y = 0; y < h; y += 4){
			for(i = 0; i < 4; i++)
				for(x = 0; x < w; x++){
					uint32 a = ((y+i)<<logw)+x;
					uint32 s = swizzle(x, y+i, logw)&mask;
					uint8 c = a & 1 ? px[a>>1] >> 4 : px[a>>1] & 0xF;
					tmpbuf[s>>1] = s & 1 ? (tmpbuf[s>>1]&0xF) | c<<4 : (tmpbuf[s>>1]&0xF0) | c;
				}
			memcpy(&px[y<<(logw-1)], tmpbuf, 2*w);
		}
	}else if(raster->format & Raster::PAL8 && natras->flags & Ps2Raster::SWIZZLED8){
		for(y = 0; y < h; y += 4){
			for(i = 0; i < 4; i++)
				for(x = 0; x < w; x++){
					uint32 a = ((y+i)<<logw)+x;
					uint32 s = swizzle(x, y+i, logw)&mask;
					tmpbuf[s] = px[a];
				}
			memcpy(&px[y<<logw], tmpbuf, 4*w);
		}
	}
}